

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_ReflectionSwapFields_Test::TestBody
          (ArenaTest_ReflectionSwapFields_Test *this)

{
  bool bVar1;
  TestAllTypes *pTVar2;
  TestAllTypes *pTVar3;
  Reflection *this_00;
  char *pcVar4;
  Arena *rhs;
  AssertHelper local_750;
  Message local_748;
  unsigned_long local_740;
  int local_734;
  undefined1 local_730 [8];
  AssertionResult gtest_ar_8;
  Message local_718;
  undefined1 local_710 [8];
  AssertionResult gtest_ar_7;
  Message local_6f8;
  Arena *local_6f0;
  CachedBlock ***local_6e8;
  undefined1 local_6e0 [8];
  AssertionResult gtest_ar_6;
  TestAllTypes message;
  TestAllTypes *arena3_message;
  Arena arena3;
  Message local_2d8;
  Arena *local_2d0;
  Arena *local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_5;
  Message local_2a8;
  Arena *local_2a0;
  CachedBlock ***local_298;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_4;
  Message local_278;
  unsigned_long local_270;
  int local_264;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_3;
  Message local_248;
  unsigned_long local_240;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_2;
  string output;
  Message local_1f8;
  Arena *local_1f0;
  Arena *local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_1;
  Message local_1c8;
  Arena *local_1c0;
  CachedBlock ***local_1b8;
  undefined1 local_1b0 [8];
  AssertionResult gtest_ar;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *reflection;
  TestAllTypes *arena2_message;
  TestAllTypes *arena1_message;
  undefined1 local_160 [8];
  Arena arena2;
  Arena arena1;
  ArenaTest_ReflectionSwapFields_Test *this_local;
  
  Arena::Arena((Arena *)&arena2.impl_.first_arena_.cached_blocks_);
  Arena::Arena((Arena *)local_160);
  pTVar2 = Arena::Create<proto2_unittest::TestAllTypes>
                     ((Arena *)&arena2.impl_.first_arena_.cached_blocks_);
  pTVar3 = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)local_160);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar2);
  this_00 = proto2_unittest::TestAllTypes::GetReflection();
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&gtest_ar.message_);
  Reflection::ListFields
            (this_00,&pTVar2->super_Message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&gtest_ar.message_);
  Reflection::SwapFields
            (this_00,&pTVar2->super_Message,&pTVar3->super_Message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&gtest_ar.message_);
  local_1b8 = &arena2.impl_.first_arena_.cached_blocks_;
  local_1c0 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
  testing::internal::EqHelper::
  Compare<google::protobuf::Arena_*,_google::protobuf::Arena_*,_nullptr>
            ((EqHelper *)local_1b0,"&arena1","arena1_message->GetArena()",(Arena **)&local_1b8,
             &local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b0);
  if (!bVar1) {
    testing::Message::Message(&local_1c8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2ce,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b0);
  local_1e8 = (Arena *)local_160;
  local_1f0 = protobuf::MessageLite::GetArena((MessageLite *)pTVar3);
  testing::internal::EqHelper::
  Compare<google::protobuf::Arena_*,_google::protobuf::Arena_*,_nullptr>
            ((EqHelper *)local_1e0,"&arena2","arena2_message->GetArena()",&local_1e8,&local_1f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&output.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2cf,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&output.field_2 + 8),&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&output.field_2 + 8));
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  std::__cxx11::string::string((string *)&gtest_ar_2.message_);
  protobuf::MessageLite::SerializeToString((MessageLite *)pTVar2,(string *)&gtest_ar_2.message_);
  local_234 = 0;
  local_240 = std::__cxx11::string::size();
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_230,"0","output.size()",&local_234,&local_240);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_248);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2d2,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar3);
  Reflection::SwapFields
            (this_00,&pTVar2->super_Message,&pTVar3->super_Message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&gtest_ar.message_);
  protobuf::MessageLite::SerializeToString((MessageLite *)pTVar3,(string *)&gtest_ar_2.message_);
  local_264 = 0;
  local_270 = std::__cxx11::string::size();
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_260,"0","output.size()",&local_264,&local_270);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2d6,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar2);
  pTVar2 = Arena::Create<proto2_unittest::TestAllTypes>
                     ((Arena *)&arena2.impl_.first_arena_.cached_blocks_);
  pTVar3 = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)local_160);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar2);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar3);
  Reflection::SwapFields
            (this_00,&pTVar2->super_Message,&pTVar3->super_Message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&gtest_ar.message_);
  local_298 = &arena2.impl_.first_arena_.cached_blocks_;
  local_2a0 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
  testing::internal::EqHelper::
  Compare<google::protobuf::Arena_*,_google::protobuf::Arena_*,_nullptr>
            ((EqHelper *)local_290,"&arena1","arena1_message->GetArena()",(Arena **)&local_298,
             &local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar1) {
    testing::Message::Message(&local_2a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2df,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_2a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  local_2c8 = (Arena *)local_160;
  local_2d0 = protobuf::MessageLite::GetArena((MessageLite *)pTVar3);
  testing::internal::EqHelper::
  Compare<google::protobuf::Arena_*,_google::protobuf::Arena_*,_nullptr>
            ((EqHelper *)local_2c0,"&arena2","arena2_message->GetArena()",&local_2c8,&local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&arena3.impl_.first_arena_.cached_blocks_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2e0,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&arena3.impl_.first_arena_.cached_blocks_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&arena3.impl_.first_arena_.cached_blocks_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar2);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar3);
  pTVar2 = Arena::Create<proto2_unittest::TestAllTypes>
                     ((Arena *)&arena2.impl_.first_arena_.cached_blocks_);
  Arena::Arena((Arena *)&arena3_message);
  pTVar3 = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)&arena3_message);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar3);
  Reflection::SwapFields
            (this_00,&pTVar2->super_Message,&pTVar3->super_Message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&gtest_ar.message_);
  Arena::~Arena((Arena *)&arena3_message);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>(pTVar2);
  pTVar2 = Arena::Create<proto2_unittest::TestAllTypes>
                     ((Arena *)&arena2.impl_.first_arena_.cached_blocks_);
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)&gtest_ar_6.message_);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>(pTVar2);
  Reflection::SwapFields
            (this_00,&pTVar2->super_Message,(Message *)&gtest_ar_6.message_,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)&gtest_ar.message_);
  local_6e8 = &arena2.impl_.first_arena_.cached_blocks_;
  local_6f0 = protobuf::MessageLite::GetArena((MessageLite *)pTVar2);
  testing::internal::EqHelper::
  Compare<google::protobuf::Arena_*,_google::protobuf::Arena_*,_nullptr>
            ((EqHelper *)local_6e0,"&arena1","arena1_message->GetArena()",(Arena **)&local_6e8,
             &local_6f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6e0);
  if (!bVar1) {
    testing::Message::Message(&local_6f8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2f3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_6f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_6f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6e0);
  rhs = protobuf::MessageLite::GetArena((MessageLite *)&gtest_ar_6.message_);
  testing::internal::EqHelper::Compare<google::protobuf::Arena>
            ((EqHelper *)local_710,"nullptr","message.GetArena()",(nullptr_t)0x0,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_710);
  if (!bVar1) {
    testing::Message::Message(&local_718);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_710);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2f4,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_718);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_718);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_710);
  protobuf::MessageLite::SerializeToString((MessageLite *)pTVar2,(string *)&gtest_ar_2.message_);
  local_734 = 0;
  local_740 = std::__cxx11::string::size();
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_730,"0","output.size()",&local_734,&local_740);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_730);
  if (!bVar1) {
    testing::Message::Message(&local_748);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_730);
    testing::internal::AssertHelper::AssertHelper
              (&local_750,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x2f6,pcVar4);
    testing::internal::AssertHelper::operator=(&local_750,&local_748);
    testing::internal::AssertHelper::~AssertHelper(&local_750);
    testing::Message::~Message(&local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_730);
  TestUtil::ExpectAllFieldsSet<proto2_unittest::TestAllTypes>((TestAllTypes *)&gtest_ar_6.message_);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)&gtest_ar_6.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)&gtest_ar.message_);
  Arena::~Arena((Arena *)local_160);
  Arena::~Arena((Arena *)&arena2.impl_.first_arena_.cached_blocks_);
  return;
}

Assistant:

TEST(ArenaTest, ReflectionSwapFields) {
  Arena arena1;
  Arena arena2;
  TestAllTypes* arena1_message;
  TestAllTypes* arena2_message;

  // Case 1: messages on different arenas, only one message is set.
  arena1_message = Arena::Create<TestAllTypes>(&arena1);
  arena2_message = Arena::Create<TestAllTypes>(&arena2);
  TestUtil::SetAllFields(arena1_message);
  const Reflection* reflection = arena1_message->GetReflection();
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*arena1_message, &fields);
  reflection->SwapFields(arena1_message, arena2_message, fields);
  EXPECT_EQ(&arena1, arena1_message->GetArena());
  EXPECT_EQ(&arena2, arena2_message->GetArena());
  std::string output;
  arena1_message->SerializeToString(&output);
  EXPECT_EQ(0, output.size());
  TestUtil::ExpectAllFieldsSet(*arena2_message);
  reflection->SwapFields(arena1_message, arena2_message, fields);
  arena2_message->SerializeToString(&output);
  EXPECT_EQ(0, output.size());
  TestUtil::ExpectAllFieldsSet(*arena1_message);

  // Case 2: messages on different arenas, both messages are set.
  arena1_message = Arena::Create<TestAllTypes>(&arena1);
  arena2_message = Arena::Create<TestAllTypes>(&arena2);
  TestUtil::SetAllFields(arena1_message);
  TestUtil::SetAllFields(arena2_message);
  reflection->SwapFields(arena1_message, arena2_message, fields);
  EXPECT_EQ(&arena1, arena1_message->GetArena());
  EXPECT_EQ(&arena2, arena2_message->GetArena());
  TestUtil::ExpectAllFieldsSet(*arena1_message);
  TestUtil::ExpectAllFieldsSet(*arena2_message);

  // Case 3: messages on different arenas with different lifetimes.
  arena1_message = Arena::Create<TestAllTypes>(&arena1);
  {
    Arena arena3;
    TestAllTypes* arena3_message = Arena::Create<TestAllTypes>(&arena3);
    TestUtil::SetAllFields(arena3_message);
    reflection->SwapFields(arena1_message, arena3_message, fields);
  }
  TestUtil::ExpectAllFieldsSet(*arena1_message);

  // Case 4: one message on arena, the other on heap.
  arena1_message = Arena::Create<TestAllTypes>(&arena1);
  TestAllTypes message;
  TestUtil::SetAllFields(arena1_message);
  reflection->SwapFields(arena1_message, &message, fields);
  EXPECT_EQ(&arena1, arena1_message->GetArena());
  EXPECT_EQ(nullptr, message.GetArena());
  arena1_message->SerializeToString(&output);
  EXPECT_EQ(0, output.size());
  TestUtil::ExpectAllFieldsSet(message);
}